

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3SnippetAdvance(char **ppIter,i64 *piIter,int iNext)

{
  long in_FS_OFFSET;
  i64 iIter;
  char *pIter;
  i64 local_40;
  byte *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (byte *)*ppIter;
  if (local_38 != (byte *)0x0) {
    local_40 = *piIter;
    if (local_40 < iNext) {
      do {
        if (*local_38 < 2) {
          local_40 = -1;
          local_38 = (byte *)0x0;
          break;
        }
        fts3GetDeltaPosition((char **)&local_38,&local_40);
      } while (local_40 < iNext);
    }
    *piIter = local_40;
    *ppIter = (char *)local_38;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3SnippetAdvance(char **ppIter, i64 *piIter, int iNext){
  char *pIter = *ppIter;
  if( pIter ){
    i64 iIter = *piIter;

    while( iIter<iNext ){
      if( 0==(*pIter & 0xFE) ){
        iIter = -1;
        pIter = 0;
        break;
      }
      fts3GetDeltaPosition(&pIter, &iIter);
    }

    *piIter = iIter;
    *ppIter = pIter;
  }
}